

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O0

int secp256k1_tagged_sha256
              (secp256k1_context *ctx,uchar *hash32,uchar *tag,size_t taglen,uchar *msg,
              size_t msglen)

{
  undefined1 local_a8 [8];
  secp256k1_sha256 sha;
  size_t msglen_local;
  uchar *msg_local;
  size_t taglen_local;
  uchar *tag_local;
  uchar *hash32_local;
  secp256k1_context *ctx_local;
  
  sha.bytes = msglen;
  if (hash32 == (uchar *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"hash32 != NULL");
    ctx_local._4_4_ = 0;
  }
  else if (tag == (uchar *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"tag != NULL");
    ctx_local._4_4_ = 0;
  }
  else if (msg == (uchar *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"msg != NULL");
    ctx_local._4_4_ = 0;
  }
  else {
    secp256k1_sha256_initialize_tagged((secp256k1_sha256 *)local_a8,tag,taglen);
    secp256k1_sha256_write((secp256k1_sha256 *)local_a8,msg,sha.bytes);
    secp256k1_sha256_finalize((secp256k1_sha256 *)local_a8,hash32);
    ctx_local._4_4_ = 1;
  }
  return ctx_local._4_4_;
}

Assistant:

int secp256k1_tagged_sha256(const secp256k1_context* ctx, unsigned char *hash32, const unsigned char *tag, size_t taglen, const unsigned char *msg, size_t msglen) {
    secp256k1_sha256 sha;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(hash32 != NULL);
    ARG_CHECK(tag != NULL);
    ARG_CHECK(msg != NULL);

    secp256k1_sha256_initialize_tagged(&sha, tag, taglen);
    secp256k1_sha256_write(&sha, msg, msglen);
    secp256k1_sha256_finalize(&sha, hash32);
    return 1;
}